

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base_sink-inl.h
# Opt level: O0

void __thiscall spdlog::sinks::base_sink<std::mutex>::flush(base_sink<std::mutex> *this)

{
  mutex_type *in_RDI;
  lock_guard<std::mutex> lock;
  lock_guard<std::mutex> *in_stack_ffffffffffffffe0;
  
  std::lock_guard<std::mutex>::lock_guard(in_stack_ffffffffffffffe0,in_RDI);
  (**(code **)((in_RDI->super___mutex_base)._M_mutex.__align + 0x38))();
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1720e9);
  return;
}

Assistant:

void SPDLOG_INLINE spdlog::sinks::base_sink<Mutex>::flush()
{
    std::lock_guard<Mutex> lock(mutex_);
    flush_();
}